

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

Pseudo * linearize_expression(Proc *proc,AstNode *expr)

{
  ravitype_t rVar1;
  int iVar2;
  int iVar3;
  undefined4 uVar4;
  UnaryOperatorType op;
  BinaryOperatorType op_00;
  opcode oVar5;
  C_MemoryAllocator *pCVar6;
  ravitype_t rVar7;
  Pseudo *pPVar8;
  undefined1 *puVar9;
  void *pvVar10;
  Constant *pCVar11;
  uint *puVar12;
  AstNode *pAVar13;
  Pseudo *pPVar14;
  Pseudo *pPVar15;
  char *pcVar16;
  byte *ptr;
  Pseudo *pseudo;
  AstNode *pAVar17;
  AstNode *expr_00;
  Instruction *insn;
  LinearizerState *pLVar18;
  char cVar19;
  uint uVar20;
  ravitype_t rVar21;
  _Bool is_and;
  ulong uVar22;
  char *__format;
  CompilerState *pCVar23;
  Pseudo *pPVar24;
  opcode oVar25;
  char *__s;
  TextBuffer *mb;
  byte bVar26;
  bool bVar27;
  Pseudo *local_d0;
  int local_c4;
  int local_ac;
  Constant local_a8;
  PtrListIterator local_98 [4];
  
  switch(expr->type) {
  case EXPR_LITERAL:
    rVar1 = (expr->field_2).common_expr.type.type_code;
    if (rVar1 < RAVI_TNUMFLT) {
      if (rVar1 == RAVI_TNIL) {
        pCVar6 = proc->linearizer->compiler_state->allocator;
        pPVar8 = (Pseudo *)(*pCVar6->calloc)(pCVar6->arena,1,0x30);
        uVar20 = *(uint *)pPVar8 & 0xfffffff0 | 7;
      }
      else {
        if (rVar1 != RAVI_TBOOLEAN) {
          if (rVar1 == RAVI_TNUMINT) goto LAB_0011a35f;
          goto switchD_00119c24_caseD_13;
        }
        pAVar13 = (expr->field_2).function_stmt.function_expr;
        pCVar6 = proc->linearizer->compiler_state->allocator;
        pPVar8 = (Pseudo *)(*pCVar6->calloc)(pCVar6->arena,1,0x30);
        uVar20 = (pAVar13 == (AstNode *)0x0) + 8 + (*(uint *)pPVar8 & 0xfffffff0);
      }
      *(uint *)pPVar8 = uVar20;
      (pPVar8->field_3).proc = proc;
      break;
    }
    if ((rVar1 == RAVI_TNUMFLT) || (rVar1 == RAVI_TSTRING)) {
LAB_0011a35f:
      pCVar11 = allocate_constant(proc,expr);
      pCVar6 = proc->linearizer->compiler_state->allocator;
      pPVar8 = (Pseudo *)(*pCVar6->calloc)(pCVar6->arena,1,0x30);
      uVar20 = *(uint *)pPVar8;
      *(uint *)pPVar8 = uVar20 & 0xfffffff0 | 5;
      (pPVar8->field_3).constant = pCVar11;
      *(uint *)pPVar8 = uVar20 & 0xfff00000 | 5 | (uint)pCVar11->index << 4;
      break;
    }
    if (rVar1 == RAVI_TVARARGS) {
      pCVar23 = proc->linearizer->compiler_state;
      mb = &pCVar23->error_message;
      __s = "Var args not supported";
      goto LAB_0011ab39;
    }
  default:
switchD_00119c24_caseD_13:
    pLVar18 = proc->linearizer;
LAB_0011ab28:
    pCVar23 = pLVar18->compiler_state;
    mb = &pCVar23->error_message;
    __s = "feature not yet implemented";
LAB_0011ab39:
    raviX_buffer_add_string(mb,__s);
    longjmp((__jmp_buf_tag *)pCVar23->env,1);
  case EXPR_SYMBOL:
    pPVar8 = linearize_symbol_expression(proc,expr);
    break;
  case EXPR_Y_INDEX:
  case EXPR_FIELD_SELECTOR:
    pPVar8 = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
    break;
  case EXPR_SUFFIXED:
    pPVar8 = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
    pAVar13 = (expr->field_2).function_stmt.function_expr;
    raviX_ptrlist_forward_iterator(local_98,(PtrList *)(expr->field_2).for_stmt.for_statement_list);
    pAVar17 = (AstNode *)raviX_ptrlist_iter_next(local_98);
    while (expr_00 = pAVar17, expr_00 != (AstNode *)0x0) {
      uVar20 = *(uint *)pPVar8 & 0xf;
      if (uVar20 == 0xe) {
        pPVar8 = indexed_load(proc,pPVar8);
      }
      else if (uVar20 == 0xb) {
        if ((pPVar8->field_3).range_in_use != 0) goto LAB_0011aa76;
        *(uint *)pPVar8 = *(uint *)pPVar8 & 0xfffffff0 | 4;
      }
      if (expr_00->type - EXPR_Y_INDEX < 2) {
        pPVar14 = linearize_expression(proc,(expr_00->field_2).function_stmt.function_expr);
        rVar1 = ((expr_00->field_2).function_call_expr.method_name)->hash;
        if (((undefined1  [48])*pPVar14 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
          pPVar14 = indexed_load(proc,pPVar14);
        }
        pPVar8 = create_indexed_pseudo
                           (proc,(pAVar13->field_2).common_expr.type.type_code,pPVar8,rVar1,pPVar14,
                            (expr_00->field_2).common_expr.type.type_code,expr->line_number);
      }
      else {
        if (expr_00->type != EXPR_FUNCTION_CALL) {
          pCVar23 = proc->linearizer->compiler_state;
          mb = &pCVar23->error_message;
          __s = "Unexpected expr type in suffix list";
          goto LAB_0011ab39;
        }
        pPVar8 = linearize_function_call_expression(proc,expr_00,pAVar13,pPVar8);
      }
      pAVar17 = (AstNode *)raviX_ptrlist_iter_next(local_98);
      pAVar13 = expr_00;
    }
    break;
  case EXPR_UNARY:
    op = (expr->field_2).unary_expr.unary_op;
    rVar1 = ((expr->field_2).function_call_expr.method_name)->hash;
    if (((op - UNOPR_MINUS < 4) || (op == UNOPR_TO_INTEGER && rVar1 != RAVI_TNUMINT)) ||
       (rVar1 != RAVI_TNUMFLT && op == UNOPR_TO_NUMBER)) {
      rVar7 = RAVI_TANY;
      if ((1 < op - UNOPR_BNOT) && (rVar7 = rVar1, op != UNOPR_MINUS)) {
        if (op == UNOPR_LEN) {
          rVar7 = (expr->field_2).common_expr.type.type_code;
        }
        else {
          rVar7 = (uint)(op != UNOPR_TO_INTEGER) * 8 + RAVI_TNUMINT;
        }
      }
      local_d0 = allocate_temp_pseudo(proc,rVar7,true);
    }
    else {
      local_d0 = (Pseudo *)0x0;
    }
    pPVar8 = linearize_expression(proc,(expr->field_2).function_stmt.function_expr);
    switch(op - UNOPR_MINUS) {
    case 0:
      bVar26 = 0x2c;
      if (rVar1 != RAVI_TNUMINT) {
        bVar26 = (rVar1 == RAVI_TNUMFLT) * '\x02' + 0x2b;
      }
      goto LAB_0011a66b;
    case 1:
      bVar26 = 0x39;
      goto LAB_0011a66b;
    case 2:
      bVar26 = 0x38;
      goto LAB_0011a66b;
    case 3:
      bVar26 = ((rVar1 + ~(RAVI_TNUMBER|RAVI_TBOOLEAN) & 0xffffffdfU) == 0U) + 0x2e;
      goto LAB_0011a66b;
    case 4:
      bVar27 = rVar1 == RAVI_TNUMINT;
      bVar26 = 0x30;
      break;
    case 5:
      bVar27 = rVar1 == RAVI_TNUMFLT;
      bVar26 = 0x31;
      break;
    case 6:
      bVar27 = rVar1 == RAVI_TARRAYINT;
      bVar26 = 0x34;
      break;
    case 7:
      bVar27 = rVar1 == RAVI_TARRAYFLT;
      bVar26 = 0x35;
      break;
    case 8:
      bVar27 = rVar1 == RAVI_TTABLE;
      bVar26 = 0x36;
      break;
    case 9:
      bVar27 = rVar1 == RAVI_TSTRING;
      bVar26 = 0x33;
      break;
    case 10:
      bVar27 = rVar1 == RAVI_TFUNCTION;
      bVar26 = 0x32;
      break;
    case 0xb:
      bVar26 = 0x37;
      goto LAB_0011a66b;
    default:
      pcVar16 = raviX_get_unary_opr_str(op);
      __format = "unexpected unary op %s";
LAB_0011ab5e:
      __s = (char *)local_98;
      snprintf(__s,100,__format,pcVar16);
      pCVar23 = proc->linearizer->compiler_state;
      mb = &pCVar23->error_message;
      goto LAB_0011ab39;
    }
    if (bVar27) {
      bVar26 = 0;
    }
LAB_0011a66b:
    if (bVar26 == 0) break;
    uVar20 = expr->line_number;
    pCVar6 = proc->linearizer->compiler_state->allocator;
    insn = (Instruction *)(*pCVar6->calloc)(pCVar6->arena,1,0x28);
    *(byte *)insn = bVar26;
    insn->line_number = uVar20;
    if (op == UNOPR_TO_TYPE) {
      local_98[0].__list = (PtrList *)(expr->field_2).goto_stmt.name;
      local_98[0].__head._0_4_ = 0x101;
      pCVar11 = add_constant(proc,(Constant *)local_98);
      pCVar6 = proc->linearizer->compiler_state->allocator;
      puVar12 = (uint *)(*pCVar6->calloc)(pCVar6->arena,1,0x30);
      uVar20 = *puVar12;
      *puVar12 = uVar20 & 0xfffffff0 | 5;
      *(Constant **)(puVar12 + 2) = pCVar11;
      *puVar12 = uVar20 & 0xfff00000 | 5 | (uint)pCVar11->index << 4;
      raviX_ptrlist_add((PtrList **)&insn->operands,puVar12,
                        proc->linearizer->compiler_state->allocator);
LAB_0011a726:
      pPVar14 = (Pseudo *)0x0;
    }
    else {
      if (((1 < op - UNOPR_BNOT) && (op != UNOPR_LEN)) && (op != UNOPR_MINUS)) goto LAB_0011a726;
      pPVar14 = add_instruction_operand(proc,insn,pPVar8);
      free_temp_pseudo(proc,pPVar8,false);
      pPVar8 = local_d0;
    }
    if (((undefined1  [48])*pPVar8 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      pPVar8 = indexed_load(proc,pPVar8);
    }
    if (((undefined1  [48])*pPVar8 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
LAB_0011aa57:
      __assert_fail("pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
    }
    raviX_ptrlist_add((PtrList **)&insn->targets,pPVar8,proc->linearizer->compiler_state->allocator)
    ;
    if ((insn->block != (BasicBlock *)0x0) && (insn->block != proc->current_bb)) {
LAB_0011aa95:
      __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x1b1,"void add_instruction(Proc *, Instruction *)");
    }
    raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,insn,
                      proc->linearizer->compiler_state->allocator);
    insn->block = proc->current_bb;
    if (pPVar14 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pPVar14,false);
    }
    if ((bVar26 & 0xfe) == 0x30) {
      uVar20 = expr->line_number;
      pCVar6 = proc->linearizer->compiler_state->allocator;
      puVar9 = (undefined1 *)(*pCVar6->calloc)(pCVar6->arena,1,0x28);
      *puVar9 = 0x4a;
      *(uint *)(puVar9 + 0x20) = uVar20;
      if (((undefined1  [48])*pPVar8 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        pPVar15 = indexed_load(proc,pPVar8);
        pPVar14 = pPVar15;
      }
      else {
        pPVar15 = (Pseudo *)0x0;
        pPVar14 = pPVar8;
      }
      raviX_ptrlist_add((PtrList **)(puVar9 + 8),pPVar14,proc->linearizer->compiler_state->allocator
                       );
      free_temp_pseudo(proc,pPVar8,false);
      if (((undefined1  [48])*local_d0 & (undefined1  [48])0xf) == (undefined1  [48])0xe)
      goto LAB_0011aa57;
      raviX_ptrlist_add((PtrList **)(puVar9 + 0x10),local_d0,
                        proc->linearizer->compiler_state->allocator);
      if ((*(BasicBlock **)(puVar9 + 0x18) != (BasicBlock *)0x0) &&
         (*(BasicBlock **)(puVar9 + 0x18) != proc->current_bb)) goto LAB_0011aa95;
      raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,puVar9,
                        proc->linearizer->compiler_state->allocator);
      *(BasicBlock **)(puVar9 + 0x18) = proc->current_bb;
LAB_0011a906:
      pPVar8 = local_d0;
      if (pPVar15 != (Pseudo *)0x0) {
        free_temp_pseudo(proc,pPVar15,false);
      }
    }
    break;
  case EXPR_BINARY:
    op_00 = (expr->field_2).binary_expr.binary_op;
    if ((ulong)op_00 == 0x14) {
      is_and = false;
    }
    else {
      if (op_00 != BINOPR_AND) {
        rVar1 = (expr->field_2).common_expr.type.type_code;
        if (op_00 == BINOPR_NE) {
          local_d0 = allocate_temp_pseudo(proc,rVar1,true);
        }
        else {
          local_d0 = (Pseudo *)0x0;
        }
        pPVar8 = allocate_temp_pseudo(proc,rVar1,true);
        pAVar13 = (expr->field_2).function_stmt.function_expr;
        pAVar17 = (expr->field_2).binary_expr.expr_right;
        pPVar15 = linearize_expression(proc,pAVar13);
        pPVar14 = linearize_expression(proc,pAVar17);
        if (BINOPR_GE < op_00) {
          pcVar16 = raviX_get_binary_opr_str(op_00);
          __format = "unexpected binary op %s";
          goto LAB_0011ab5e;
        }
        oVar5 = *(opcode *)(&DAT_0013844c + (ulong)op_00 * 4);
        rVar1 = (pAVar13->field_2).common_expr.type.type_code;
        rVar7 = (pAVar17->field_2).common_expr.type.type_code;
        if ((int)oVar5 < 0x22) {
          if ((oVar5 != op_add) && (oVar5 != op_mul)) goto LAB_0011a926;
          bVar27 = rVar7 == RAVI_TNUMFLT && rVar1 == RAVI_TNUMINT;
LAB_0011a541:
          pPVar24 = pPVar15;
          rVar21 = rVar1;
          if (!bVar27) goto LAB_0011a926;
        }
        else {
          if ((oVar5 == op_lt) || (oVar5 == op_le)) {
            bVar27 = op_00 - BINOPR_GT < 2;
            goto LAB_0011a541;
          }
LAB_0011a926:
          pPVar24 = pPVar14;
          pPVar14 = pPVar15;
          rVar21 = rVar7;
          rVar7 = rVar1;
        }
        oVar25 = oVar5;
        if ((int)oVar5 < 0xf) {
          if (oVar5 == op_add) {
LAB_0011a992:
            if ((rVar7 != RAVI_TNUMFLT) || (rVar21 != RAVI_TNUMFLT)) {
              if ((rVar7 != RAVI_TNUMFLT) || (rVar21 != RAVI_TNUMINT)) {
                oVar25 = oVar5 + op_addff;
                rVar21 = rVar7 ^ RAVI_TNUMINT | rVar21 ^ RAVI_TNUMINT;
                goto LAB_0011a9b1;
              }
LAB_0011a9de:
              oVar25 = oVar5 + op_add;
              goto LAB_0011a9e1;
            }
          }
          else {
            if (oVar5 != op_sub) {
              if (oVar5 != op_mul) goto LAB_0011a9e1;
              goto LAB_0011a992;
            }
LAB_0011a9c6:
            if ((rVar7 != RAVI_TNUMFLT) || (rVar21 != RAVI_TNUMFLT)) {
              if ((rVar7 != RAVI_TNUMFLT) || (rVar21 != RAVI_TNUMINT)) {
                if ((rVar7 != RAVI_TNUMINT) || (rVar21 != RAVI_TNUMFLT)) {
                  rVar7 = rVar7 ^ RAVI_TNUMINT;
                  rVar21 = rVar21 ^ RAVI_TNUMINT;
                  oVar25 = oVar5 + op_addfi;
                  goto LAB_0011a97f;
                }
                oVar25 = oVar5 + op_addff;
                goto LAB_0011a9e1;
              }
              goto LAB_0011a9de;
            }
          }
LAB_0011a9d0:
          oVar25 = oVar5 + op_ret;
        }
        else if (oVar5 < op_leii) {
          uVar22 = (ulong)oVar5;
          if ((0x2aa00000UL >> (uVar22 & 0x3f) & 1) == 0) {
            if ((0x2480000000U >> (uVar22 & 0x3f) & 1) == 0) {
              if (uVar22 == 0xf) goto LAB_0011a9c6;
              goto LAB_0011a9e1;
            }
            if ((rVar7 == RAVI_TNUMINT) && (rVar21 == RAVI_TNUMINT)) goto LAB_0011a9d0;
            rVar7 = rVar7 ^ RAVI_TNUMFLT;
            rVar21 = rVar21 ^ RAVI_TNUMFLT;
            oVar25 = oVar5 + op_add;
LAB_0011a97f:
            rVar21 = rVar21 | rVar7;
LAB_0011a9b1:
            if (rVar21 != ~RAVI_TANY) {
              oVar25 = oVar5;
            }
          }
          else {
            oVar25 = oVar5 + (rVar21 == RAVI_TNUMINT && rVar7 == RAVI_TNUMINT);
          }
        }
LAB_0011a9e1:
        create_binary_instruction(proc,oVar25,pPVar14,pPVar24,pPVar8,expr->line_number);
        free_temp_pseudo(proc,pPVar14,false);
        free_temp_pseudo(proc,pPVar24,false);
        if (op_00 == BINOPR_NE) {
          linearize_negate_condition(proc,expr->line_number,pPVar8,local_d0);
          pPVar8 = local_d0;
        }
        break;
      }
      is_and = true;
    }
    pPVar8 = linearize_bool(proc,expr,is_and);
    break;
  case EXPR_FUNCTION:
    pPVar8 = linearize_function_expr(proc,expr);
    break;
  case EXPR_TABLE_LITERAL:
    pPVar8 = allocate_temp_pseudo(proc,(expr->field_2).common_expr.type.type_code,true);
    uVar20 = expr->line_number;
    rVar1 = (expr->field_2).common_expr.type.type_code;
    pCVar6 = proc->linearizer->compiler_state->allocator;
    pcVar16 = (char *)(*pCVar6->calloc)(pCVar6->arena,1,0x28);
    cVar19 = '<';
    if (rVar1 != RAVI_TARRAYINT) {
      cVar19 = (rVar1 == RAVI_TARRAYFLT) * '\x02' + ';';
    }
    *pcVar16 = cVar19;
    *(uint *)(pcVar16 + 0x20) = uVar20;
    if (((undefined1  [48])*pPVar8 & (undefined1  [48])0xf) == (undefined1  [48])0xe)
    goto LAB_0011aa57;
    raviX_ptrlist_add((PtrList **)(pcVar16 + 0x10),pPVar8,
                      proc->linearizer->compiler_state->allocator);
    if ((*(BasicBlock **)(pcVar16 + 0x18) == (BasicBlock *)0x0) ||
       (*(BasicBlock **)(pcVar16 + 0x18) == proc->current_bb)) {
      raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,pcVar16,
                        proc->linearizer->compiler_state->allocator);
      *(BasicBlock **)(pcVar16 + 0x18) = proc->current_bb;
      local_c4 = raviX_ptrlist_size((PtrList *)(expr->field_2).function_stmt.function_expr);
      raviX_ptrlist_forward_iterator
                (local_98,(PtrList *)(expr->field_2).function_stmt.function_expr);
      pvVar10 = raviX_ptrlist_iter_next(local_98);
      if (pvVar10 != (void *)0x0) {
        local_ac = 1;
        do {
          local_c4 = local_c4 + -1;
          rVar1 = (expr->field_2).common_expr.type.type_code;
          pAVar13 = *(AstNode **)((long)pvVar10 + 0x20);
          if (pAVar13 == (AstNode *)0x0) {
            local_a8.type = 8;
            local_a8.index = 0;
            local_a8.field_2 = (anon_union_8_3_4e90b7ae_for_Constant_2)(long)local_ac;
            local_ac = local_ac + 1;
            pCVar11 = add_constant(proc,&local_a8);
            pCVar6 = proc->linearizer->compiler_state->allocator;
            pPVar14 = (Pseudo *)(*pCVar6->calloc)(pCVar6->arena,1,0x30);
            uVar20 = *(uint *)pPVar14;
            *(uint *)pPVar14 = uVar20 & 0xfffffff0 | 5;
            (pPVar14->field_3).constant = pCVar11;
            *(uint *)pPVar14 = uVar20 & 0xfff00000 | 5 | (uint)pCVar11->index << 4;
            iVar2 = 8;
          }
          else {
            pPVar14 = linearize_expression(proc,pAVar13);
            iVar2 = *(int *)(*(long *)(*(long *)((long)pvVar10 + 0x20) + 0x20) + 8);
          }
          pPVar15 = linearize_expression(proc,*(AstNode **)((long)pvVar10 + 0x28));
          if (((*(uint *)pPVar15 & 0xf) == 0xb) && (local_c4 != 0 || pAVar13 != (AstNode *)0x0)) {
            if ((pPVar15->field_3).range_in_use != 0) goto LAB_0011aa76;
            *(uint *)pPVar15 = *(uint *)pPVar15 & 0xfffffff0 | 4;
          }
          iVar3 = *(int *)(*(long *)((long)pvVar10 + 0x28) + 8);
          uVar4 = *(undefined4 *)((long)pvVar10 + 4);
          if (rVar1 == RAVI_TARRAYFLT) {
            bVar26 = iVar3 == 0x10 | 0x46;
          }
          else if (rVar1 == RAVI_TARRAYINT) {
            bVar26 = iVar3 == 8 | 0x44;
          }
          else {
            cVar19 = (rVar1 == RAVI_TTABLE) * '\x03';
            bVar26 = cVar19 + 0x3e;
            if (iVar2 == 0x101) {
              bVar26 = cVar19 + 0x40;
            }
            else if (iVar2 == 8) {
              bVar26 = cVar19 + 0x3f;
            }
          }
          pCVar6 = proc->linearizer->compiler_state->allocator;
          ptr = (byte *)(*pCVar6->calloc)(pCVar6->arena,1,0x28);
          *ptr = bVar26;
          *(undefined4 *)(ptr + 0x20) = uVar4;
          if (((undefined1  [48])*pPVar8 & (undefined1  [48])0xf) == (undefined1  [48])0xe)
          goto LAB_0011aa57;
          raviX_ptrlist_add((PtrList **)(ptr + 0x10),pPVar8,
                            proc->linearizer->compiler_state->allocator);
          if (((undefined1  [48])*pPVar14 & (undefined1  [48])0xf) == (undefined1  [48])0xe)
          goto LAB_0011aa57;
          raviX_ptrlist_add((PtrList **)(ptr + 0x10),pPVar14,
                            proc->linearizer->compiler_state->allocator);
          if (((undefined1  [48])*pPVar15 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
            pseudo = indexed_load(proc,pPVar15);
            pPVar24 = pseudo;
          }
          else {
            pseudo = (Pseudo *)0x0;
            pPVar24 = pPVar15;
          }
          raviX_ptrlist_add((PtrList **)(ptr + 8),pPVar24,
                            proc->linearizer->compiler_state->allocator);
          if ((*(BasicBlock **)(ptr + 0x18) != (BasicBlock *)0x0) &&
             (*(BasicBlock **)(ptr + 0x18) != proc->current_bb)) goto LAB_0011aa95;
          raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr,
                            proc->linearizer->compiler_state->allocator);
          *(BasicBlock **)(ptr + 0x18) = proc->current_bb;
          if (pseudo != (Pseudo *)0x0) {
            free_temp_pseudo(proc,pseudo,false);
          }
          free_temp_pseudo(proc,pPVar14,false);
          free_temp_pseudo(proc,pPVar15,false);
          pvVar10 = raviX_ptrlist_iter_next(local_98);
        } while (pvVar10 != (void *)0x0);
      }
      break;
    }
    goto LAB_0011aa95;
  case EXPR_CONCAT:
    pPVar8 = linearize_concat_expression(proc,expr);
    break;
  case EXPR_BUILTIN:
    if ((expr->field_2).unary_expr.unary_op == 0x111) {
      uVar20 = expr->line_number;
      pCVar6 = proc->linearizer->compiler_state->allocator;
      puVar9 = (undefined1 *)(*pCVar6->calloc)(pCVar6->arena,1,0x28);
      *puVar9 = 0x5f;
      *(uint *)(puVar9 + 0x20) = uVar20;
      local_d0 = allocate_temp_pseudo(proc,RAVI_TUSERDATA,true);
      pPVar15 = (Pseudo *)0x0;
      pvVar10 = raviX_ptrlist_nth_entry((PtrList *)(expr->field_2).function_stmt.function_expr,0);
      local_98[0].__list = *(PtrList **)((long)pvVar10 + 0x20);
      local_98[0].__head._0_4_ = 0x101;
      pCVar11 = add_constant(proc,(Constant *)local_98);
      pCVar6 = proc->linearizer->compiler_state->allocator;
      puVar12 = (uint *)(*pCVar6->calloc)(pCVar6->arena,1,0x30);
      uVar20 = *puVar12;
      *puVar12 = uVar20 & 0xfffffff0 | 5;
      *(Constant **)(puVar12 + 2) = pCVar11;
      *puVar12 = uVar20 & 0xfff00000 | 5 | (uint)pCVar11->index << 4;
      raviX_ptrlist_add((PtrList **)(puVar9 + 8),puVar12,proc->linearizer->compiler_state->allocator
                       );
      pAVar13 = (AstNode *)
                raviX_ptrlist_nth_entry((PtrList *)(expr->field_2).function_stmt.function_expr,1);
      pPVar14 = linearize_expression(proc,pAVar13);
      pPVar8 = pPVar14;
      if (((undefined1  [48])*pPVar14 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        pPVar15 = indexed_load(proc,pPVar14);
        pPVar8 = pPVar15;
      }
      raviX_ptrlist_add((PtrList **)(puVar9 + 8),pPVar8,proc->linearizer->compiler_state->allocator)
      ;
      if (((undefined1  [48])*local_d0 & (undefined1  [48])0xf) == (undefined1  [48])0xe)
      goto LAB_0011aa57;
      raviX_ptrlist_add((PtrList **)(puVar9 + 0x10),local_d0,
                        proc->linearizer->compiler_state->allocator);
      if ((*(BasicBlock **)(puVar9 + 0x18) != (BasicBlock *)0x0) &&
         (*(BasicBlock **)(puVar9 + 0x18) != proc->current_bb)) goto LAB_0011aa95;
      raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,puVar9,
                        proc->linearizer->compiler_state->allocator);
      *(BasicBlock **)(puVar9 + 0x18) = proc->current_bb;
      free_temp_pseudo(proc,pPVar14,false);
      goto LAB_0011a906;
    }
    pLVar18 = proc->linearizer;
    goto LAB_0011ab28;
  }
  if (pPVar8 == (Pseudo *)0x0) {
    __assert_fail("result",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x7e3,"Pseudo *linearize_expression(Proc *, AstNode *)");
  }
  check_pseudo_is_top(proc,pPVar8);
  if (((*(uint *)pPVar8 & 0xf) == 0xb) && (((expr->field_2).embedded_C_stmt.is_decl & 1U) != 0)) {
    if ((pPVar8->field_3).range_in_use != 0) {
LAB_0011aa76:
      __assert_fail("pseudo->range_in_use == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x24a,"Pseudo *convert_range_to_temp(Pseudo *)");
    }
    *(uint *)pPVar8 = *(uint *)pPVar8 & 0xfffffff0 | 4;
  }
  return pPVar8;
}

Assistant:

static Pseudo *linearize_expression(Proc *proc, AstNode *expr)
{
	Pseudo *result = NULL;
	switch (expr->type) {
	case EXPR_LITERAL: {
		result = linearize_literal(proc, expr);
	} break;
	case EXPR_BINARY: {
		result = linearize_binary_operator(proc, expr);
	} break;
	case EXPR_FUNCTION: {
		result = linearize_function_expr(proc, expr);
	} break;
	case EXPR_UNARY: {
		result = linearize_unary_operator(proc, expr);
	} break;
	case EXPR_SUFFIXED: {
		result = linearize_suffixedexpr(proc, expr);
	} break;
	case EXPR_SYMBOL: {
		result = linearize_symbol_expression(proc, expr);
	} break;
	case EXPR_TABLE_LITERAL: {
		result = linearize_table_constructor(proc, expr);
	} break;
	case EXPR_Y_INDEX:
	case EXPR_FIELD_SELECTOR: {
		result = linearize_expression(proc, expr->index_expr.expr);
	} break;
	case EXPR_CONCAT: {
		result = linearize_concat_expression(proc, expr);
	} break;
	case EXPR_BUILTIN: {
		result = linearize_builtin_expression(proc, expr);
	} break;
	default:
		handle_error(proc->linearizer->compiler_state, "feature not yet implemented");
		break;
	}
	assert(result);
	check_pseudo_is_top(proc, result);
	if (result->type == PSEUDO_RANGE && expr->common_expr.truncate_results) {
		// Need to truncate the results to 1
		return convert_range_to_temp(result);
	}
	return result;
}